

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

repeat_at_least *
toml::detail::syntax::unquoted_key(repeat_at_least *__return_storage_ptr__,spec *s)

{
  pointer __p;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  either keychar;
  alpha local_98;
  either local_70;
  character_in_range local_50;
  digit local_40;
  character local_28;
  
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__alpha_004e07c0;
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df8e8;
  local_40.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x7a61;
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df8e8;
  local_50.from_ = 'A';
  local_50.to_ = 'Z';
  either::either<toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_98.scanner_,(character_in_range *)&local_40,&local_50);
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e0718;
  local_40.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004df8e8;
  local_40.scanner_.from_ = '0';
  local_40.scanner_.to_ = '9';
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df828;
  local_50.from_ = '-';
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df828;
  local_28.value_ = '_';
  either::
  either<toml::detail::syntax::alpha,toml::detail::syntax::digit,toml::detail::character,toml::detail::character>
            (&local_70,&local_98,&local_40,(character *)&local_50,&local_28);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_98.scanner_.others_);
  if (s->v1_1_0_allow_non_english_in_bare_keys == true) {
    local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004dfb50;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::syntax::non_ascii_key_char>
              (&local_70.others_,(non_ascii_key_char *)&local_98);
  }
  (__return_storage_ptr__->super_scanner_base)._vptr_scanner_base =
       (_func_int **)&PTR__repeat_at_least_004dfaa0;
  __return_storage_ptr__->length_ = 1;
  _Var1._M_head_impl = (scanner_base *)operator_new(0x20);
  (_Var1._M_head_impl)->_vptr_scanner_base = (_func_int **)&PTR__either_004df9f0;
  _Var1._M_head_impl[1]._vptr_scanner_base =
       (_func_int **)
       local_70.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var1._M_head_impl[2]._vptr_scanner_base =
       (_func_int **)
       local_70.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  _Var1._M_head_impl[3]._vptr_scanner_base =
       (_func_int **)
       local_70.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)0x0;
  (__return_storage_ptr__->other_).scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_98);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE repeat_at_least unquoted_key(const spec& s)
{
    auto keychar = either(
            alpha(s), digit(s), character{0x2D}, character{0x5F}
        );

    if(s.v1_1_0_allow_non_english_in_bare_keys)
    {
        keychar.push_back(non_ascii_key_char(s));
    }

    return repeat_at_least(1, std::move(keychar));
}